

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O0

RESULT_TYPE __thiscall
duckdb::Interpolator<true>::InterpolateInternal<signed_char,duckdb::QuantileDirect<signed_char>>
          (Interpolator<true> *this,char *v_t,QuantileDirect<signed_char> *accessor)

{
  INPUT_TYPE *pIVar1;
  QuantileDirect<signed_char> *in_RDX;
  long in_RSI;
  byte *in_RDI;
  char *unaff_retaddr;
  char *in_stack_00000008;
  char *in_stack_00000010;
  QuantileCompare<duckdb::QuantileDirect<signed_char>_> in_stack_00000020;
  QuantileCompare<duckdb::QuantileDirect<signed_char>_> comp;
  QuantileCompare<duckdb::QuantileDirect<signed_char>_> local_30;
  QuantileDirect<signed_char> *local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  QuantileCompare<duckdb::QuantileDirect<signed_char>_>::QuantileCompare
            (&local_30,in_RDX,(bool)(*in_RDI & 1));
  std::nth_element<signed_char*,duckdb::QuantileCompare<duckdb::QuantileDirect<signed_char>>>
            (in_stack_00000010,in_stack_00000008,unaff_retaddr,in_stack_00000020);
  pIVar1 = QuantileDirect<signed_char>::operator()
                     (local_18,(INPUT_TYPE *)(local_10 + *(long *)(in_RDI + 8)));
  return *pIVar1;
}

Assistant:

typename ACCESSOR::RESULT_TYPE InterpolateInternal(INPUT_TYPE *v_t, const ACCESSOR &accessor = ACCESSOR()) const {
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
		return accessor(v_t[FRN]);
	}